

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O3

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo1(Segment *this)

{
  double dVar1;
  double m10;
  double m01;
  double m00;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  uint64_t local_58;
  double local_50;
  uint64_t local_48 [3];
  
  local_50 = 0.0;
  local_70 = 0.0;
  local_60 = getNormalMoment(this,(uint64_t *)&local_50,(uint64_t *)&local_70);
  local_70 = 0.0;
  local_78 = 4.94065645841247e-324;
  local_50 = local_60;
  local_70 = getNormalMoment(this,(uint64_t *)&local_70,(uint64_t *)&local_78);
  local_78 = 4.94065645841247e-324;
  local_58 = 0;
  local_78 = getNormalMoment(this,(uint64_t *)&local_78,&local_58);
  local_58 = 2;
  local_48[2] = 0;
  local_68 = getCentralMoment(this,&local_58,local_48 + 2,&local_50,&local_78,&local_70);
  local_48[1] = 0;
  local_48[0] = 2;
  dVar1 = getCentralMoment(this,local_48 + 1,local_48,&local_50,&local_78,&local_70);
  return (dVar1 + local_68) / (local_60 * local_60);
}

Assistant:

const double
Segment::getHuMomentInvariantNo1()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            getCentralMoment(2, 0, m00, m10, m01) +
            getCentralMoment(0, 2, m00, m10, m01)
        )
        /
        std::pow(m00, 2)
    );
}